

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

bool __thiscall
google::protobuf::internal::ExtensionSet::ParseMessageSetItemLite
          (ExtensionSet *this,CodedInputStream *input,ExtensionFinder *extension_finder,
          FieldSkipper *field_skipper)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  byte *pbVar9;
  byte *pbVar10;
  uint32 uVar11;
  CodedInputStream local_a8;
  size_type *local_58;
  string message_data;
  
  local_58 = &message_data._M_string_length;
  message_data._M_dataplus._M_p = (pointer)0x0;
  message_data._M_string_length._0_1_ = 0;
  uVar8 = 0;
  message_data.field_2._8_8_ = extension_finder;
LAB_00144258:
  do {
    pbVar9 = input->buffer_;
    if (pbVar9 < input->buffer_end_) {
      uVar4 = (uint)*pbVar9;
      if ((char)*pbVar9 < '\0') goto LAB_0014427a;
      input->buffer_ = pbVar9 + 1;
    }
    else {
      uVar4 = 0;
LAB_0014427a:
      uVar4 = io::CodedInputStream::ReadTagFallback(input,uVar4);
    }
    if ((int)uVar4 < 0x1a) {
      if (uVar4 == 0) goto LAB_00144498;
      if (uVar4 == 0xc) {
        uVar8 = 1;
        goto LAB_0014449b;
      }
      if (uVar4 != 0x10) goto LAB_001442c0;
      pbVar9 = input->buffer_;
      if (pbVar9 < input->buffer_end_) {
        bVar1 = *pbVar9;
        uVar8 = (ulong)bVar1;
        uVar11 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_00144319;
        input->buffer_ = pbVar9 + 1;
      }
      else {
        uVar11 = 0;
LAB_00144319:
        uVar8 = io::CodedInputStream::ReadVarint32Fallback(input,uVar11);
        if ((long)uVar8 < 0) goto LAB_00144498;
      }
      if (message_data._M_dataplus._M_p == (pointer)0x0) goto LAB_00144258;
      local_a8.buffer_ = (uint8 *)local_58;
      local_a8.total_bytes_read_ = (int)message_data._M_dataplus._M_p;
      local_a8.buffer_end_ = (uint8 *)((long)local_58 + (long)local_a8.total_bytes_read_);
      local_a8.input_ = (ZeroCopyInputStream *)0x0;
      local_a8.overflow_bytes_ = 0;
      local_a8.last_tag_ = 0;
      local_a8.legitimate_message_end_ = false;
      local_a8.aliasing_enabled_ = false;
      local_a8.buffer_size_after_limit_ = 0;
      local_a8.total_bytes_limit_ = 0x7fffffff;
      local_a8.extension_pool_ = (DescriptorPool *)0x0;
      local_a8.extension_factory_ = (MessageFactory *)0x0;
      local_a8.recursion_budget_ = input->recursion_budget_;
      local_a8.current_limit_ = local_a8.total_bytes_read_;
      local_a8.recursion_limit_ = local_a8.recursion_budget_;
      bVar3 = ParseField(this,(int)uVar8 * 8 + 2,&local_a8,
                         (ExtensionFinder *)message_data.field_2._8_8_,field_skipper);
      if (!bVar3) {
        io::CodedInputStream::~CodedInputStream(&local_a8);
        goto LAB_00144498;
      }
      message_data._M_dataplus._M_p = (pointer)0x0;
      *(byte *)local_58 = 0;
      io::CodedInputStream::~CodedInputStream(&local_a8);
      goto LAB_00144258;
    }
    if (uVar4 == 0x1a) {
      if ((int)uVar8 == 0) break;
      cVar2 = ParseField(this,(int)uVar8 * 8 + 2,input,(ExtensionFinder *)message_data.field_2._8_8_
                         ,field_skipper);
    }
    else {
LAB_001442c0:
      iVar5 = (*field_skipper->_vptr_FieldSkipper[2])(field_skipper,input,(ulong)uVar4);
      cVar2 = (char)iVar5;
    }
    if (cVar2 == '\0') goto LAB_00144498;
  } while( true );
  pbVar9 = input->buffer_;
  if (pbVar9 < input->buffer_end_) {
    bVar1 = *pbVar9;
    uVar8 = (ulong)bVar1;
    uVar11 = (uint32)bVar1;
    if (-1 < (char)bVar1) {
      input->buffer_ = pbVar9 + 1;
      goto LAB_001443ff;
    }
  }
  else {
    uVar11 = 0;
  }
  uVar8 = io::CodedInputStream::ReadVarint32Fallback(input,uVar11);
  if ((uVar8 & 0x8000000080000000) != 0) {
LAB_00144498:
    uVar8 = 0;
    goto LAB_0014449b;
  }
LAB_001443ff:
  uVar4 = (uint)uVar8;
  iVar5 = 0x1f;
  if ((uVar4 | 1) != 0) {
    for (; (uVar4 | 1) >> iVar5 == 0; iVar5 = iVar5 + -1) {
    }
  }
  bVar1 = (byte)uVar8;
  std::__cxx11::string::resize((ulong)&local_58,(char)(iVar5 * 9 + 0x49U >> 6) + bVar1);
  if (uVar4 < 0x80) {
    *(byte *)local_58 = bVar1;
    pbVar9 = (byte *)((long)local_58 + 1);
  }
  else {
    *(byte *)local_58 = bVar1 | 0x80;
    uVar8 = uVar8 >> 7 & 0x1ffffff;
    if (uVar4 < 0x4000) {
      *(byte *)((long)local_58 + 1) = (byte)uVar8;
      pbVar9 = (byte *)((long)local_58 + 2);
    }
    else {
      pbVar9 = (byte *)((long)local_58 + 2);
      do {
        pbVar10 = pbVar9;
        uVar6 = (uint)uVar8;
        pbVar10[-1] = (byte)uVar8 | 0x80;
        uVar7 = uVar6 >> 7;
        uVar8 = (ulong)uVar7;
        pbVar9 = pbVar10 + 1;
      } while (0x3fff < uVar6);
      *pbVar10 = (byte)uVar7;
    }
  }
  bVar3 = io::CodedInputStream::ReadRaw(input,pbVar9,uVar4);
  uVar8 = 0;
  if (!bVar3) {
LAB_0014449b:
    if (local_58 != &message_data._M_string_length) {
      operator_delete(local_58);
    }
    return SUB81(uVar8,0);
  }
  goto LAB_00144258;
}

Assistant:

bool ExtensionSet::ParseMessageSetItemLite(io::CodedInputStream* input,
                                           ExtensionFinder* extension_finder,
                                           FieldSkipper* field_skipper) {
  struct MSLite {
    bool ParseField(int type_id, io::CodedInputStream* input) {
      return me->ParseField(
          WireFormatLite::WIRETYPE_LENGTH_DELIMITED + 8 * type_id, input,
          extension_finder, field_skipper);
    }

    bool SkipField(uint32 tag, io::CodedInputStream* input) {
      return field_skipper->SkipField(input, tag);
    }

    ExtensionSet* me;
    ExtensionFinder* extension_finder;
    FieldSkipper* field_skipper;
  };

  return ParseMessageSetItemImpl(input,
                                 MSLite{this, extension_finder, field_skipper});
}